

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec_choose.c
# Opt level: O0

void codec_choose(codec *codec,int flags)

{
  _Bool _Var1;
  int flags_local;
  codec *codec_local;
  
  _Var1 = codec_choose_forced(codec,flags);
  if (((!_Var1) && (_Var1 = codec_choose_arm(codec), !_Var1)) &&
     (_Var1 = codec_choose_x86(codec), !_Var1)) {
    codec->enc = base64_stream_encode_plain;
    codec->dec = base64_stream_decode_plain;
  }
  return;
}

Assistant:

void
codec_choose (struct codec *codec, int flags)
{
	// User forced a codec:
	if (codec_choose_forced(codec, flags)) {
		return;
	}

	// Runtime feature detection:
	if (codec_choose_arm(codec)) {
		return;
	}
	if (codec_choose_x86(codec)) {
		return;
	}
	codec->enc = base64_stream_encode_plain;
	codec->dec = base64_stream_decode_plain;
}